

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O3

FT_Error T42_Driver_Init(FT_Module module)

{
  FT_Error FVar1;
  FT_Module pFVar2;
  
  pFVar2 = FT_Get_Module(module->library,"truetype");
  if (pFVar2 == (FT_Module)0x0) {
    FVar1 = 0xb;
  }
  else {
    module[2].library = (FT_Library)pFVar2->clazz;
    FVar1 = 0;
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Driver_Init( FT_Module  module )        /* T42_Driver */
  {
    T42_Driver  driver = (T42_Driver)module;
    FT_Module   ttmodule;


    ttmodule = FT_Get_Module( module->library, "truetype" );
    if ( !ttmodule )
    {
      FT_ERROR(( "T42_Driver_Init: cannot access `truetype' module\n" ));
      return FT_THROW( Missing_Module );
    }

    driver->ttclazz = (FT_Driver_Class)ttmodule->clazz;

    return FT_Err_Ok;
  }